

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O3

void __thiscall QFbVtHandler::handleSignal(QFbVtHandler *this)

{
  int __fd;
  __pid_t __pid;
  ssize_t sVar1;
  int *piVar2;
  long in_FS_OFFSET;
  char sigNo;
  byte local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QSocketNotifier::setEnabled(SUB81(*(undefined8 *)(this + 0x20),0));
  local_21 = 0xaa;
  __fd = *(int *)(this + 0x1c);
  do {
    sVar1 = read(__fd,&local_21,1);
    if (sVar1 != -1) {
      if (sVar1 == 1) {
        if (local_21 < 0x14) {
          if (local_21 == 0x12) {
            setTTYCursor(false);
            setKeyboardEnabled(this,false);
            QMetaObject::activate((QObject *)this,&staticMetaObject,2,(void **)0x0);
          }
          else if ((local_21 == 2) || (local_21 == 0xf)) {
            handleInt(this);
            *(undefined ***)this = &PTR_metaObject_001555c0;
            setKeyboardEnabled(this,true);
            setTTYCursor(true);
            if (*(long *)(this + 0x20) != 0) {
              close(*(int *)(this + 0x18));
              close(*(int *)(this + 0x1c));
            }
            QObject::~QObject((QObject *)this);
            return;
          }
        }
        else if (local_21 == 0x14) {
          QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)0x0);
          setKeyboardEnabled(this,true);
          setTTYCursor(true);
          __pid = getpid();
          kill(__pid,0x13);
        }
      }
      break;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  QSocketNotifier::setEnabled(SUB81(*(undefined8 *)(this + 0x20),0));
  return;
}

Assistant:

void QFbVtHandler::handleSignal()
{
#ifdef VTH_ENABLED
    m_signalNotifier->setEnabled(false);

    char sigNo;
    if (QT_READ(m_sigFd[1], &sigNo, sizeof(sigNo)) == sizeof(sigNo)) {
        switch (sigNo) {
        case SIGINT:
        case SIGTERM:
            handleInt();
            break;
        case SIGTSTP:
            emit aboutToSuspend();
            setKeyboardEnabled(true);
            setTTYCursor(true);
            ::kill(getpid(), SIGSTOP);
            break;
        case SIGCONT:
            setTTYCursor(false);
            setKeyboardEnabled(false);
            emit resumed();
            break;
        default:
            break;
        }
    }

    m_signalNotifier->setEnabled(true);
#endif
}